

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O2

void __thiscall VarianceEstimator_Zero_Test::TestBody(VarianceEstimator_Zero_Test *this)

{
  float fVar1;
  long lVar2;
  char *message;
  float fVar3;
  undefined1 auVar4 [16];
  float fVar5;
  AssertHelper local_28;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  AssertionResult gtest_ar;
  
  fVar3 = 0.0;
  lVar2 = 1;
  auVar4 = ZEXT816(0) << 0x40;
  while (lVar2 != 0x65) {
    fVar5 = (float)lVar2;
    fVar1 = 10.0 - fVar3;
    lVar2 = lVar2 + 1;
    fVar3 = fVar3 + fVar1 / fVar5;
    auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar1),ZEXT416((uint)(10.0 - fVar3)));
  }
  local_20.ptr_._0_4_ = auVar4._0_4_ / 99.0;
  local_28.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<float,int>
            ((internal *)&gtest_ar,"ve.Variance()","0",(float *)&local_20,(int *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_20);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x398,message);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_20);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(VarianceEstimator, Zero) {
    VarianceEstimator<Float> ve;
    for (int i = 0; i < 100; ++i)
        ve.Add(10.);
    EXPECT_EQ(ve.Variance(), 0);
}